

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

State * __thiscall re2::DFA::CachedState(DFA *this,int *inst,int ninst,uint32_t flag)

{
  int iVar1;
  RE2 *pRVar2;
  int i;
  iterator iVar3;
  State *pSVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  State *s;
  long local_50;
  long local_48;
  State state;
  
  s = &state;
  state.inst_ = inst;
  state.ninst_ = ninst;
  state.flag_ = flag;
  iVar3 = std::
          _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->state_cache_)._M_h,&s);
  if (iVar3.super__Node_iterator_base<re2::DFA::State_*,_true>._M_cur == (__node_type *)0x0) {
    pRVar2 = this->prog_;
    iVar1._0_1_ = (pRVar2->options_).posix_syntax_;
    iVar1._1_1_ = (pRVar2->options_).longest_match_;
    iVar1._2_1_ = (pRVar2->options_).log_errors_;
    iVar1._3_1_ = (pRVar2->options_).literal_;
    lVar7 = (long)iVar1;
    local_50 = lVar7 + 1;
    local_48 = (long)ninst;
    lVar6 = (local_48 << 0x22) + (local_50 << 0x23);
    lVar5 = lVar6 + 0x3800000000 >> 0x20;
    if (this->mem_budget_ < lVar5) {
      this->mem_budget_ = -1;
      s = (State *)0x0;
    }
    else {
      this->mem_budget_ = this->mem_budget_ - lVar5;
      pSVar4 = (State *)__gnu_cxx::new_allocator<char>::allocate
                                  ((new_allocator<char> *)&s,lVar6 + 0x1000000000 >> 0x20,
                                   (void *)0x0);
      s = pSVar4;
      if ((int)local_50 == 0) {
        lVar7 = -1;
      }
      else {
        memset(pSVar4 + 1,0,lVar7 * 8 + 8);
      }
      for (lVar5 = 0; lVar5 <= lVar7; lVar5 = lVar5 + 1) {
        (&pSVar4[1].inst_)[lVar5] = (int *)0x0;
      }
      pSVar4->inst_ = (int *)(&pSVar4[1].inst_ + local_50);
      memmove(&pSVar4[1].inst_ + local_50,inst,local_48 << 2);
      pSVar4->ninst_ = ninst;
      pSVar4->flag_ = flag;
      std::__detail::
      _Insert_base<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&this->state_cache_,&s);
    }
  }
  else {
    s = *(State **)((long)iVar3.super__Node_iterator_base<re2::DFA::State_*,_true>._M_cur + 8);
  }
  return s;
}

Assistant:

DFA::State* DFA::CachedState(int* inst, int ninst, uint32_t flag) {
  //mutex_.AssertHeld();

  // Look in the cache for a pre-existing state.
  // We have to initialise the struct like this because otherwise
  // MSVC will complain about the flexible array member. :(
  State state;
  state.inst_ = inst;
  state.ninst_ = ninst;
  state.flag_ = flag;
  StateSet::iterator it = state_cache_.find(&state);
  if (it != state_cache_.end()) {
    if (ExtraDebug)
      fprintf(stderr, " -cached-> %s\n", DumpState(*it).c_str());
    return *it;
  }

  // Must have enough memory for new state.
  // In addition to what we're going to allocate,
  // the state cache hash table seems to incur about 40 bytes per
  // State*, empirically.
  const int kStateCacheOverhead = 40;
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int mem = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
            ninst*sizeof(int);
  if (mem_budget_ < mem + kStateCacheOverhead) {
    mem_budget_ = -1;
    return NULL;
  }
  mem_budget_ -= mem + kStateCacheOverhead;

  // Allocate new state along with room for next_ and inst_.
  char* space = std::allocator<char>().allocate(mem);
  State* s = new (space) State;
  (void) new (s->next_) std::atomic<State*>[nnext];
  // Work around a unfortunate bug in older versions of libstdc++.
  // (https://gcc.gnu.org/bugzilla/show_bug.cgi?id=64658)
  for (int i = 0; i < nnext; i++)
    (void) new (s->next_ + i) std::atomic<State*>(NULL);
  s->inst_ = new (s->next_ + nnext) int[ninst];
  memmove(s->inst_, inst, ninst*sizeof s->inst_[0]);
  s->ninst_ = ninst;
  s->flag_ = flag;
  if (ExtraDebug)
    fprintf(stderr, " -> %s\n", DumpState(s).c_str());

  // Put state in cache and return it.
  state_cache_.insert(s);
  return s;
}